

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

bool __thiscall wasm::PossibleContents::isNull(PossibleContents *this)

{
  bool bVar1;
  bool local_45;
  Literal local_30;
  PossibleContents *local_18;
  PossibleContents *this_local;
  
  local_18 = this;
  bVar1 = isLiteral(this);
  local_45 = false;
  if (bVar1) {
    getLiteral(&local_30,this);
    local_45 = wasm::Literal::isNull(&local_30);
  }
  this_local._7_1_ = local_45;
  if (bVar1) {
    wasm::Literal::~Literal(&local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isNull() const { return isLiteral() && getLiteral().isNull(); }